

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

TaskExecutionResult __thiscall
duckdb::PipelineTask::ExecuteTask(PipelineTask *this,TaskExecutionMode mode)

{
  unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true> *this_00
  ;
  _Alloc_hider __p;
  PipelineExecuteResult PVar1;
  pointer pPVar2;
  Event *this_01;
  InternalException *this_02;
  allocator local_61;
  string local_60;
  __weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = &this->pipeline_executor;
  if ((this->pipeline_executor).
      super_unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PipelineExecutor_*,_std::default_delete<duckdb::PipelineExecutor>_>
      .super__Head_base<0UL,_duckdb::PipelineExecutor_*,_false>._M_head_impl ==
      (PipelineExecutor *)0x0) {
    make_uniq<duckdb::PipelineExecutor,duckdb::ClientContext&,duckdb::Pipeline&>
              ((duckdb *)&local_60,this->pipeline->executor->context,this->pipeline);
    __p._M_p = local_60._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
    ::reset((__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
             *)this_00,(pointer)__p._M_p);
    ::std::unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>::
    ~unique_ptr((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
                 *)&local_60);
  }
  pPVar2 = unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
           ::operator->(this_00);
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)&local_60);
  ::std::__weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Task,void>
            (local_40,(__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
  PipelineExecutor::SetTaskForInterrupts(pPVar2,(weak_ptr<duckdb::Task,_true> *)local_40);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
  pPVar2 = unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
           ::operator->(this_00);
  if (mode == PROCESS_PARTIAL) {
    PVar1 = PipelineExecutor::Execute(pPVar2,0x32);
    if (PVar1 == NOT_FINISHED) {
      return TASK_NOT_FINISHED;
    }
    if (PVar1 == INTERRUPTED) {
      return TASK_BLOCKED;
    }
  }
  else {
    PVar1 = PipelineExecutor::Execute(pPVar2);
    if (PVar1 == INTERRUPTED) {
      return TASK_BLOCKED;
    }
    if (PVar1 == NOT_FINISHED) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,"Execute without limit should not return NOT_FINISHED",
                 &local_61);
      InternalException::InternalException(this_02,&local_60);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_01 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  Event::FinishTask(this_01);
  ::std::__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>::
  reset((__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_> *
        )this_00,(pointer)0x0);
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult PipelineTask::ExecuteTask(TaskExecutionMode mode) {
	if (!pipeline_executor) {
		pipeline_executor = make_uniq<PipelineExecutor>(pipeline.GetClientContext(), pipeline);
	}

	pipeline_executor->SetTaskForInterrupts(shared_from_this());

	if (mode == TaskExecutionMode::PROCESS_PARTIAL) {
		auto res = pipeline_executor->Execute(PARTIAL_CHUNK_COUNT);

		switch (res) {
		case PipelineExecuteResult::NOT_FINISHED:
			return TaskExecutionResult::TASK_NOT_FINISHED;
		case PipelineExecuteResult::INTERRUPTED:
			return TaskExecutionResult::TASK_BLOCKED;
		case PipelineExecuteResult::FINISHED:
			break;
		}
	} else {
		auto res = pipeline_executor->Execute();
		switch (res) {
		case PipelineExecuteResult::NOT_FINISHED:
			throw InternalException("Execute without limit should not return NOT_FINISHED");
		case PipelineExecuteResult::INTERRUPTED:
			return TaskExecutionResult::TASK_BLOCKED;
		case PipelineExecuteResult::FINISHED:
			break;
		}
	}

	event->FinishTask();
	pipeline_executor.reset();
	return TaskExecutionResult::TASK_FINISHED;
}